

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLFormulasLoader.cpp
# Opt level: O3

bool __thiscall COLLADASaxFWL::FormulasLoader::begin__bool(FormulasLoader *this)

{
  FormulaNewParam *pFVar1;
  
  if (this->mWithinNewParam == true) {
    pFVar1 = (FormulaNewParam *)operator_new(0x38);
    pFVar1->_vptr_FormulaNewParam = (_func_int **)&PTR__FormulaNewParam_0090fee8;
    pFVar1->mValueType = VALUETYPE_BOOL;
    (pFVar1->mName)._M_dataplus._M_p = (pointer)&(pFVar1->mName).field_2;
    (pFVar1->mName)._M_string_length = 0;
    (pFVar1->mName).field_2._M_local_buf[0] = '\0';
    this->mCurrentFormulaNewParam = pFVar1;
    std::__cxx11::string::_M_assign((string *)&pFVar1->mName);
  }
  return true;
}

Assistant:

bool FormulasLoader::begin__bool()
	{
		if ( mWithinNewParam )
		{
			mCurrentFormulaNewParam = FW_NEW COLLADAFW::FormulaNewParam(COLLADAFW::FormulaNewParam::VALUETYPE_BOOL);
			mCurrentFormulaNewParam->setName(mCurrentFormulaNewParamSid);
		}
		return true;
	}